

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Array<kj::ReadableDirectory::Entry> * __thiscall
kj::anon_unknown_35::InMemoryDirectory::listEntries
          (Array<kj::ReadableDirectory::Entry> *__return_storage_ptr__,InMemoryDirectory *this)

{
  size_t capacity;
  Type TVar1;
  Entry *pEVar2;
  _Base_ptr p_Var3;
  Entry *pEVar4;
  Array<kj::ReadableDirectory::Entry> *result;
  _Rb_tree_header *p_Var5;
  Fault local_90;
  Type local_88;
  String local_80;
  Entry *local_68;
  Entry *local_60;
  Entry *local_58;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  kj::_::Mutex::lock(&(this->impl).mutex,SHARED);
  capacity = (this->impl).value.entries._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pEVar2 = (Entry *)kj::_::HeapArrayDisposer::allocateImpl
                              (0x20,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0
                              );
  local_58 = pEVar2 + capacity;
  local_50 = &kj::_::HeapArrayDisposer::instance;
  p_Var3 = *(_Base_ptr *)
            ((long)&(this->impl).value.entries._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  p_Var5 = &(this->impl).value.entries._M_t._M_impl.super__Rb_tree_header;
  pEVar4 = pEVar2;
  local_68 = pEVar2;
  local_60 = pEVar2;
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    do {
      TVar1 = *(int *)&p_Var3[2]._M_parent - DIRECTORY;
      if (SYMLINK < TVar1) {
        local_90.exception = (Exception *)0x0;
        local_48 = 0;
        uStack_40 = 0;
        kj::_::Debug::Fault::init
                  (&local_90,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                  );
        kj::_::Debug::Fault::fatal(&local_90);
      }
      local_88 = TVar1;
      heapString(&local_80,*(char **)(p_Var3 + 1),
                 (size_t)((long)&p_Var3[1]._M_parent[-1]._M_right + 7));
      pEVar4->type = local_88;
      (pEVar4->name).content.ptr = local_80.content.ptr;
      (pEVar4->name).content.size_ = local_80.content.size_;
      (pEVar4->name).content.disposer = local_80.content.disposer;
      pEVar4 = pEVar4 + 1;
      local_60 = pEVar4;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
  }
  __return_storage_ptr__->ptr = pEVar2;
  __return_storage_ptr__->size_ = (long)pEVar4 - (long)pEVar2 >> 5;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  kj::_::Mutex::unlock(&(this->impl).mutex,SHARED);
  return __return_storage_ptr__;
}

Assistant:

Array<Entry> listEntries() const override {
    auto lock = impl.lockShared();
    return KJ_MAP(e, lock->entries) {
      FsNode::Type type;
      if (e.second.node.is<SymlinkNode>()) {
        type = FsNode::Type::SYMLINK;
      } else if (e.second.node.is<FileNode>()) {
        type = FsNode::Type::FILE;
      } else {
        KJ_ASSERT(e.second.node.is<DirectoryNode>());
        type = FsNode::Type::DIRECTORY;
      }

      return Entry { type, heapString(e.first) };
    };
  }